

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O0

bool __thiscall
optimization::global_expr_move::BlockOps::has_op
          (BlockOps *this,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  int __c;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *in_RSI;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *in_RDI;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> load;
  key_type *in_stack_ffffffffffffff48;
  map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
  *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
  in_stack_ffffffffffffff90;
  BlockOps *in_stack_ffffffffffffff98;
  bool local_1;
  
  std::
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  ::variant((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
             *)in_RDI,
            (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
             *)in_RSI);
  pcVar2 = &stack0xffffffffffffff98;
  bVar1 = disable_op(in_stack_ffffffffffffff98,
                     (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                      *)in_stack_ffffffffffffff90._M_cur);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pcVar2 = std::
             variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
             ::index((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                      *)in_RSI,pcVar2,__c);
    if (pcVar2 == (char *)0x0) {
      std::
      get<optimization::global_expr_move::Op,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                ((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  *)0x186f0c);
      std::
      unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
      ::find((unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
              *)in_RSI,(key_type *)0x186f19);
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
           ::end((unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
                  *)in_RSI);
      local_1 = std::__detail::operator!=
                          ((_Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
                            *)&stack0xffffffffffffff90,&local_78);
    }
    else {
      std::
      get<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                ((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  *)0x186f50);
      std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::pair
                (in_RDI,in_RSI);
      sVar3 = std::
              map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
              ::count(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_1 = sVar3 != 0;
    }
  }
  return local_1;
}

Assistant:

bool has_op(std::variant<Op, LoadOp> op) {
    // for (auto& op : ops) {
    //   auto opInst =
    //       mir::inst::OpInst(mir::inst::VarId(0), op.lhs, op.rhs, op.op);
    //   std::cout << opInst << std::endl;
    // }
    if (disable_op(op)) {
      return false;
    }
    if (op.index() == 0) {
      return ops.find(std::get<Op>(op)) != ops.end();
    } else {
      auto load = std::get<LoadOp>(op);
      return loads.count(load.first);
    }
  }